

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseFrameSet(TidyDocImpl *doc,Node *frameset,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  Bool BVar2;
  code *pcStack_98;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *frameset_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if (frameset == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
  }
  else {
    pNStack_20 = frameset;
    if ((doc->config).value[1].v == 0) {
      doc->badAccess = doc->badAccess | 0x10;
    }
  }
  while( true ) {
    memory._40_8_ = prvTidyGetToken(doc,IgnoreWhitespace);
    if ((Node *)memory._40_8_ == (Node *)0x0) {
      prvTidyReport(doc,pNStack_20,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((((Node *)memory._40_8_)->tag == pNStack_20->tag) &&
       (((Node *)memory._40_8_)->type == EndTag)) break;
    BVar2 = InsertMisc(pNStack_20,(Node *)memory._40_8_);
    if (BVar2 == no) {
      if (((Node *)memory._40_8_)->tag == (Dict *)0x0) {
        prvTidyReport(doc,pNStack_20,(Node *)memory._40_8_,0x235);
        prvTidyFreeNode(doc,(Node *)memory._40_8_);
      }
      else {
        BVar2 = prvTidynodeIsElement((Node *)memory._40_8_);
        if (((BVar2 == no) || (((Node *)memory._40_8_)->tag == (Dict *)0x0)) ||
           ((((Node *)memory._40_8_)->tag->model & 4) == 0)) {
          if ((((Node *)memory._40_8_ != (Node *)0x0) &&
              (((Node *)memory._40_8_)->tag != (Dict *)0x0)) &&
             (((Node *)memory._40_8_)->tag->id == TidyTag_BODY)) {
            prvTidyUngetToken(doc);
            memory._40_8_ = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
            prvTidyReport(doc,pNStack_20,(Node *)memory._40_8_,0x247);
          }
          if (((*(int *)(memory._40_8_ + 0x50) == 5) && (*(long *)(memory._40_8_ + 0x38) != 0)) &&
             ((*(uint *)(*(long *)(memory._40_8_ + 0x38) + 0x20) & 0x2000) != 0)) {
            prvTidyInsertNodeAtEnd(pNStack_20,(Node *)memory._40_8_);
            pLVar1->excludeBlocks = no;
            memset(&pcStack_98,0,0x30);
            pcStack_98 = prvTidyParseFrameSet;
            memory_1.identity = (Parser *)pNStack_20;
            memory_1.original_node = (Node *)memory._40_8_;
            memory_1.reentry_mode = MixedContent;
            data.register_1 = memory_1.reentry_state;
            data.mode = 1;
            data.original_node = pNStack_20;
            data.identity = prvTidyParseFrameSet;
            data.reentry_node = (Node *)memory._40_8_;
            data._24_8_ = memory_1.reentry_node;
            data.register_2 = memory_1.mode;
            data._44_4_ = memory_1.register_1;
            prvTidypushMemory(doc,data);
            return (Node *)memory._40_8_;
          }
          if (((*(int *)(memory._40_8_ + 0x50) == 7) && (*(long *)(memory._40_8_ + 0x38) != 0)) &&
             ((*(uint *)(*(long *)(memory._40_8_ + 0x38) + 0x20) & 0x2000) != 0)) {
            prvTidyInsertNodeAtEnd(pNStack_20,(Node *)memory._40_8_);
          }
          else {
            if (((memory._40_8_ != 0) && (*(long *)(memory._40_8_ + 0x38) != 0)) &&
               (**(int **)(memory._40_8_ + 0x38) == 1)) {
              doc->badAccess = doc->badAccess | 0x40;
            }
            prvTidyReport(doc,pNStack_20,(Node *)memory._40_8_,0x235);
            prvTidyFreeNode(doc,(Node *)memory._40_8_);
          }
        }
        else {
          MoveToHead(doc,pNStack_20,(Node *)memory._40_8_);
        }
      }
    }
  }
  prvTidyFreeNode(doc,(Node *)memory._40_8_);
  pNStack_20->closed = yes;
  TrimSpaces(doc,pNStack_20);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseFrameSet)( TidyDocImpl* doc, Node *frameset, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( frameset == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        frameset = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(frameset);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |= BA_USING_FRAMES;
        }
    }

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == frameset->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            frameset->closed = yes;
            TrimSpaces(doc, frameset);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(frameset, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, frameset, node);
                continue;
            }
        }

        if ( nodeIsBODY(node) )
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
            TY_(Report)(doc, frameset, node, INSERTING_TAG);
        }

        if (node->type == StartTag && (node->tag && node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            lexer->excludeBlocks = no;
            
            /*
             * We don't really have to do anything when re-entering, except
             * setting up the state when we left. No post-processing means
             * this stays simple.
             */
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseFrameSet);
            memory.original_node = frameset;
            memory.reentry_node = node;
            memory.mode = MixedContent;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
        else if (node->type == StartEndTag && (node->tag && node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            continue;
        }

        /* discard unexpected tags */
        /* WAI [6.5.1.4] link is being discarded outside of NOFRAME */
        if ( nodeIsA(node) )
           doc->badAccess |= BA_INVALID_LINK_NOFRAMES;

        TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, frameset, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}